

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O0

int32_t WebRtcIsac_GetDownlinkMaxDelay(BwEstimatorstr *bwest_str)

{
  int local_14;
  int32_t rec_max_delay;
  BwEstimatorstr *bwest_str_local;
  
  if ((bwest_str->external_bw_info).in_use != 0) {
    __assert_fail("!bwest_str->external_bw_info.in_use",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                  ,0x2e8,"int32_t WebRtcIsac_GetDownlinkMaxDelay(const BwEstimatorstr *)");
  }
  local_14 = (int)bwest_str->rec_max_delay;
  if (local_14 < 5) {
    local_14 = 5;
  }
  else if (0x19 < local_14) {
    local_14 = 0x19;
  }
  return local_14;
}

Assistant:

int32_t
WebRtcIsac_GetDownlinkMaxDelay(const BwEstimatorstr *bwest_str)
{
  int32_t rec_max_delay;

  assert(!bwest_str->external_bw_info.in_use);

  rec_max_delay = (int32_t)(bwest_str->rec_max_delay);

  /* limit range of jitter estimate */
  if (rec_max_delay < MIN_ISAC_MD)
  {
    rec_max_delay = MIN_ISAC_MD;
  }
  else if (rec_max_delay > MAX_ISAC_MD)
  {
    rec_max_delay = MAX_ISAC_MD;
  }
  return rec_max_delay;
}